

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthCofactor0New(uint *pOut,uint *pIn,int nVars,int iVar)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  int iVar8;
  
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x20e,"void Kit_TruthCofactor0New(unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar4) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0x55555555) * 3;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    break;
  case 1:
    if (0 < (int)uVar4) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0x33333333) * 5;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    break;
  case 2:
    if (0 < (int)uVar4) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0xf0f0f0f) << 4 | pIn[uVar2] & 0xf0f0f0f;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    break;
  case 3:
    if (0 < (int)uVar4) {
      uVar2 = 0;
      do {
        pOut[uVar2] = (pIn[uVar2] & 0xff00ff) << 8 | pIn[uVar2] & 0xff00ff;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    break;
  case 4:
    if (0 < (int)uVar4) {
      uVar2 = 0;
      do {
        pOut[uVar2] = CONCAT22((short)pIn[uVar2],(short)pIn[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    break;
  default:
    if (0 < (int)uVar4) {
      bVar1 = (byte)(iVar + -5);
      uVar6 = 1 << (bVar1 & 0x1f);
      iVar5 = 2 << (bVar1 & 0x1f);
      uVar2 = 1;
      if (1 < (int)uVar6) {
        uVar2 = (ulong)uVar6;
      }
      puVar7 = pOut + (int)uVar6;
      iVar8 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar3 = 0;
          do {
            uVar6 = pIn[uVar3];
            puVar7[uVar3] = uVar6;
            pOut[uVar3] = uVar6;
            uVar3 = uVar3 + 1;
          } while (uVar2 != uVar3);
        }
        iVar8 = iVar8 + iVar5;
        puVar7 = puVar7 + iVar5;
        pOut = pOut + iVar5;
        pIn = pIn + iVar5;
      } while (iVar8 < (int)uVar4);
    }
  }
  return;
}

Assistant:

void Kit_TruthCofactor0New( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x55555555) | ((pIn[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x33333333) | ((pIn[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x0F0F0F0F) | ((pIn[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x00FF00FF) | ((pIn[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x0000FFFF) | ((pIn[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pOut[Step+i] = pIn[i];
            pIn += 2*Step;
            pOut += 2*Step;
        }
        return;
    }
}